

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O3

string * __thiscall
enact::AstSerialise::visitAssignExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,AssignExpr *expr)

{
  Expr *pEVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  ulong uVar8;
  long *local_c8;
  undefined8 local_c0;
  long local_b8;
  undefined8 uStack_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48 [2];
  long local_38 [2];
  
  pEVar1 = (expr->target)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>
           ._M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (*pEVar1->_vptr_Expr[2])(local_48,pEVar1,&this->field_0x8);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x11d325);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_58 = *plVar5;
    lStack_50 = plVar3[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar5;
    local_68 = (long *)*plVar3;
  }
  local_60 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_98 = *puVar6;
    uStack_90 = (undefined4)plVar3[3];
    uStack_8c = *(undefined4 *)((long)plVar3 + 0x1c);
    local_a8 = &local_98;
  }
  else {
    local_98 = *puVar6;
    local_a8 = (ulong *)*plVar3;
  }
  local_a0 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  pEVar1 = (expr->value)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (*pEVar1->_vptr_Expr[2])(&local_88,pEVar1,&this->field_0x8);
  uVar8 = 0xf;
  if (local_a8 != &local_98) {
    uVar8 = local_98;
  }
  if (uVar8 < (ulong)(local_80 + local_a0)) {
    uVar8 = 0xf;
    if (local_88 != local_78) {
      uVar8 = local_78[0];
    }
    if ((ulong)(local_80 + local_a0) <= uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_a8);
      goto LAB_00118b48;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88);
LAB_00118b48:
  local_c8 = &local_b8;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_b8 = *plVar3;
    uStack_b0 = puVar4[3];
  }
  else {
    local_b8 = *plVar3;
    local_c8 = (long *)*puVar4;
  }
  local_c0 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar7) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitAssignExpr(AssignExpr &expr) {
        return "(= " + visitExpr(*expr.target) + " " + visitExpr(*expr.value) + ")";
    }